

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O2

void (anonymous_namespace)::
     verifyFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>&)>
               (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_vector<unsigned_int,_std::allocator<unsigned_int>_>_ptr
                *func,char *functionName)

{
  imageException *this;
  allocator local_b3;
  allocator local_b2;
  allocator local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string error;
  
  if (func != (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_vector<unsigned_int,_std::allocator<unsigned_int>_>_ptr
               *)0x0) {
    return;
  }
  std::__cxx11::string::string((string *)&local_70,"Function ",&local_b1);
  std::__cxx11::string::string((string *)&local_90,functionName,&local_b2);
  std::operator+(&local_50,&local_70,&local_90);
  std::__cxx11::string::string((string *)&local_b0," is not defined",&local_b3);
  std::operator+(&error,&local_50,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this,error._M_dataplus._M_p);
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void verifyFunction(_T func, const char * functionName)
    {
        if ( func == nullptr ) {
            const std::string error( std::string("Function ") + std::string(functionName) + std::string(" is not defined") );
            throw imageException(error.data());
        }
    }